

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

CTPNStm * __thiscall CTcParser::parse_continue(CTcParser *this,int *err)

{
  CTcTokenizer *this_00;
  tc_toktyp_t tVar1;
  int iVar2;
  CTPNStmContinue *this_01;
  
  this_01 = (CTPNStmContinue *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)err);
  CTPNStmContinue::CTPNStmContinue(this_01);
  tVar1 = CTcTokenizer::next(G_tok);
  this_00 = G_tok;
  if (1 < tVar1 - TOKT_LBRACE) {
    if (tVar1 == TOKT_SYM) {
      (this_01->super_CTPNStmContinueBase).lbl_ = (G_tok->curtok_).text_;
      (this_01->super_CTPNStmContinueBase).lbl_len_ = (this_00->curtok_).text_len_;
      CTcTokenizer::next(this_00);
    }
    else if (tVar1 != TOKT_SEM) {
      CTcTokenizer::log_error_curtok(G_tok,0x2b56);
    }
  }
  iVar2 = parse_req_sem();
  if (iVar2 != 0) {
    *err = 1;
    this_01 = (CTPNStmContinue *)0x0;
  }
  return (CTPNStm *)this_01;
}

Assistant:

CTPNStm *CTcParser::parse_continue(int *err)
{
    CTPNStmContinue *cont_stm;

    /* create the 'break' statement */
    cont_stm = new CTPNStmContinue();

    /* skip the 'continue' keyword and check what follows */
    switch(G_tok->next())
    {
    case TOKT_SYM:
        /* set the label in the statement */
        cont_stm->set_label(G_tok->getcur());

        /* skip the label token */
        G_tok->next();
        break;

    case TOKT_SEM:
        /* keep going - we'll skip it in a moment */
        break;

    case TOKT_LBRACE:
    case TOKT_RBRACE:
        /* 
         *   they almost certainly simply left off the semicolon - don't
         *   bother with a "label expected" error, since the real error is
         *   most likely just "missing semicolon" 
         */
        break;

    default:
        /* log the error */
        G_tok->log_error_curtok(TCERR_CONT_REQ_LABEL);
        break;
    }

    /* parse the required terminating semicolon */
    if (parse_req_sem())
    {
        *err = TRUE;
        return 0;
    }

    /* return the 'continue' node */
    return cont_stm;
}